

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

FSerializer *
Serialize<sector_t*,sector_t*>
          (FSerializer *arc,char *key,TArray<sector_t_*,_sector_t_*> *value,
          TArray<sector_t_*,_sector_t_*> *param_4)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  sector_t_conflict **value_00;
  uint local_38;
  uint i;
  bool res;
  TArray<sector_t_*,_sector_t_*> *param_3_local;
  TArray<sector_t_*,_sector_t_*> *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if ((!bVar1) || (uVar3 = TArray<sector_t_*,_sector_t_*>::Size(value), uVar3 != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    bVar2 = FSerializer::isReading(arc);
    if (bVar2) {
      if (!bVar1) {
        TArray<sector_t_*,_sector_t_*>::Clear(value);
        return arc;
      }
      uVar3 = FSerializer::ArraySize(arc);
      TArray<sector_t_*,_sector_t_*>::Resize(value,uVar3);
    }
    for (local_38 = 0; uVar3 = TArray<sector_t_*,_sector_t_*>::Size(value), local_38 < uVar3;
        local_38 = local_38 + 1) {
      value_00 = TArray<sector_t_*,_sector_t_*>::operator[](value,(ulong)local_38);
      Serialize<sector_t>(arc,(char *)0x0,value_00,(sector_t_conflict **)0x0);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}